

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

bool __thiscall chaiscript::Type_Conversions::convertable_type<int(&)[3][5]>(Type_Conversions *this)

{
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_00;
  const_iterator cVar1;
  type_info *type;
  key_type local_10;
  
  local_10 = (key_type)&int_[3][5]::typeinfo;
  this_00 = &thread_cache(this)->_M_t;
  cVar1 = std::
          _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::find(this_00,&local_10);
  return (_Rb_tree_header *)cVar1._M_node != &(this_00->_M_impl).super__Rb_tree_header;
}

Assistant:

bool convertable_type() const noexcept {
      const auto type = user_type<T>().bare_type_info();
      return thread_cache().count(type) != 0;
    }